

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O0

Index __thiscall
PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex
          (PlanningUnitMADPDiscrete *this,Index t,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jactions,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *Jobservations)

{
  Index IVar1;
  const_reference pvVar2;
  reference pvVar3;
  uint in_ESI;
  Index ts;
  vector<unsigned_int,_std::allocator<unsigned_int>_> JAO_Is;
  size_t nrJAO;
  size_t nrJO;
  size_t nrJA;
  LIndex first_JAOHI;
  size_type in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff5c;
  Index in_stack_ffffffffffffff60;
  value_type in_stack_ffffffffffffff64;
  const_reference in_stack_ffffffffffffff68;
  PlanningUnitMADPDiscrete *in_stack_ffffffffffffff70;
  uint local_70;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_58;
  long local_40;
  size_t local_38;
  size_t local_30;
  value_type local_28;
  uint local_c;
  
  local_c = in_ESI;
  pvVar2 = std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::at
                     ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)
                      CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                      in_stack_ffffffffffffff48);
  local_28 = *pvVar2;
  local_30 = GetNrJointActions((PlanningUnitMADPDiscrete *)0x9d6cbd);
  local_38 = GetNrJointObservations((PlanningUnitMADPDiscrete *)0x9d6ccf);
  local_40 = local_30 * local_38;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x9d6d13);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff70,
             (size_type)in_stack_ffffffffffffff68,
             (value_type_conflict1 *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
             (allocator_type *)CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x9d6d38);
  for (local_70 = 0; local_70 < local_c; local_70 = local_70 + 1) {
    in_stack_ffffffffffffff70 =
         (PlanningUnitMADPDiscrete *)
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff64 =
         *(value_type *)
          &(((_Vector_impl *)&(in_stack_ffffffffffffff70->super_PlanningUnit)._vptr_PlanningUnit)->
           super__Vector_impl_data)._M_start;
    in_stack_ffffffffffffff68 =
         std::vector<unsigned_int,_std::allocator<unsigned_int>_>::at
                   ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
                    in_stack_ffffffffffffff48);
    in_stack_ffffffffffffff60 =
         IndexTools::ActionAndObservation_to_ActionObservationIndex
                   (in_stack_ffffffffffffff64,*in_stack_ffffffffffffff68,local_30,local_38);
    pvVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (&local_58,(ulong)local_70);
    *pvVar3 = in_stack_ffffffffffffff60;
  }
  IVar1 = Globals::CastLIndexToIndex(local_28);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](&local_58,0);
  IVar1 = ComputeHistoryIndex(in_stack_ffffffffffffff70,
                              (Index)((ulong)in_stack_ffffffffffffff68 >> 0x20),
                              (Index)in_stack_ffffffffffffff68,
                              (Index *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)
                              ,CONCAT44(IVar1,local_c));
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
             CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetJointActionObservationHistoryIndex(
        Index t, 
        const vector<Index>& Jactions,
        const vector<Index>& Jobservations
        ) const
{
    //functioning is the same as for observation histories:
    //(only now the base is the nr AO)

    LIndex first_JAOHI=_m_firstJAOHIforT.at(t);
    size_t nrJA = GetNrJointActions();
    size_t nrJO = GetNrJointObservations();
    size_t nrJAO = nrJA * nrJO;
 
    vector<Index> JAO_Is(t, 0);
    for (Index ts=0; ts<t; ts++)
        JAO_Is[ts] = IndexTools::ActionAndObservation_to_ActionObservationIndex(
                    Jactions.at(ts), Jobservations.at(ts), nrJA, nrJO);
    return( ComputeHistoryIndex(
                t, 
                CastLIndexToIndex(first_JAOHI),
                &JAO_Is[0],
                nrJAO
                )
          );    
}